

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

void Fax3BadLength(char *module,TIFF *tif,uint32_t line,uint32_t a0,uint32_t lastx)

{
  char *pcVar1;
  char *pcVar2;
  uint32_t local_54;
  uint32_t lastx_local;
  uint32_t a0_local;
  uint32_t line_local;
  TIFF *tif_local;
  char *module_local;
  
  pcVar1 = "Line length mismatch";
  if (a0 < lastx) {
    pcVar1 = "Premature EOL";
  }
  pcVar2 = "strip";
  if ((tif->tif_flags & 0x400) != 0) {
    pcVar2 = "tile";
  }
  if ((tif->tif_flags & 0x400) == 0) {
    local_54 = tif->tif_curstrip;
  }
  else {
    local_54 = tif->tif_curtile;
  }
  TIFFWarningExtR(tif,module,"%s at line %u of %s %u (got %u, expected %u)",pcVar1,(ulong)line,
                  pcVar2,local_54,a0,lastx);
  return;
}

Assistant:

static void Fax3BadLength(const char *module, TIFF *tif, uint32_t line,
                          uint32_t a0, uint32_t lastx)
{
    TIFFWarningExtR(tif, module,
                    "%s at line %" PRIu32 " of %s %" PRIu32 " (got %" PRIu32
                    ", expected %" PRIu32 ")",
                    a0 < lastx ? "Premature EOL" : "Line length mismatch", line,
                    isTiled(tif) ? "tile" : "strip",
                    (isTiled(tif) ? tif->tif_curtile : tif->tif_curstrip), a0,
                    lastx);
}